

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PortSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::InterfacePortSymbol::serializeTo(InterfacePortSymbol *this,ASTSerializer *serializer)

{
  size_t __n;
  
  if (this->interfaceDef != (DefinitionSymbol *)0x0) {
    ASTSerializer::write
              (serializer,0xc,"interfaceDef",(this->interfaceDef->super_Symbol).name._M_len);
  }
  __n = (this->modport)._M_len;
  if (__n != 0) {
    ASTSerializer::write(serializer,7,"modport",__n);
  }
  ASTSerializer::write(serializer,9,"isGeneric",(ulong)this->isGeneric);
  return;
}

Assistant:

void InterfacePortSymbol::serializeTo(ASTSerializer& serializer) const {
    if (interfaceDef)
        serializer.write("interfaceDef", interfaceDef->name);
    if (!modport.empty())
        serializer.write("modport", modport);
    serializer.write("isGeneric", isGeneric);
}